

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

BlockCoverageEventSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BlockCoverageEventSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::BlockEventExpressionSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,BlockEventExpressionSyntax *args_2,
          Token *args_3)

{
  Token atat;
  Token openParen;
  Token closeParen;
  BlockCoverageEventSyntax *this_00;
  Token *args_local_3;
  BlockEventExpressionSyntax *args_local_2;
  Token *args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (BlockCoverageEventSyntax *)allocate(this,0x48,8);
  atat.kind = args->kind;
  atat._2_1_ = args->field_0x2;
  atat.numFlags.raw = (args->numFlags).raw;
  atat.rawLen = args->rawLen;
  atat.info = args->info;
  openParen.kind = args_1->kind;
  openParen._2_1_ = args_1->field_0x2;
  openParen.numFlags.raw = (args_1->numFlags).raw;
  openParen.rawLen = args_1->rawLen;
  openParen.info = args_1->info;
  closeParen.kind = args_3->kind;
  closeParen._2_1_ = args_3->field_0x2;
  closeParen.numFlags.raw = (args_3->numFlags).raw;
  closeParen.rawLen = args_3->rawLen;
  closeParen.info = args_3->info;
  slang::syntax::BlockCoverageEventSyntax::BlockCoverageEventSyntax
            (this_00,atat,openParen,args_2,closeParen);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }